

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec_test.cpp
# Opt level: O0

void test_single<short>(void)

{
  bool bVar1;
  __type _Var2;
  short sVar3;
  ostream *poVar4;
  runtime_error *this;
  ostringstream oss;
  ostringstream b;
  ostringstream a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8a0;
  string local_5b0 [32];
  string local_590 [39];
  undefined1 local_569;
  string local_568 [32];
  ostringstream local_548 [376];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [34];
  short local_30e;
  short local_30c;
  short local_30a;
  short local_308;
  short local_306;
  short local_304;
  short local_302;
  short local_300;
  short local_2fe;
  ostringstream local_2f0 [376];
  ostringstream local_178 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_178);
  std::__cxx11::ostringstream::ostringstream(local_2f0);
  std::numeric_limits<short>::min();
  local_2fe = (short)cppcms::impl::cint<short>(0);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff880,
                      (write_int_to_stream<short> *)in_stack_fffffffffffff878);
  std::operator<<(poVar4," ");
  std::numeric_limits<short>::max();
  local_300 = (short)cppcms::impl::cint<short>(0);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff880,
                      (write_int_to_stream<short> *)in_stack_fffffffffffff878);
  std::operator<<(poVar4," ");
  local_302 = (short)cppcms::impl::cint<short>(0);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff880,
                      (write_int_to_stream<short> *)in_stack_fffffffffffff878);
  std::operator<<(poVar4," ");
  local_304 = (short)cppcms::impl::cint<short>(0);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff880,
                      (write_int_to_stream<short> *)in_stack_fffffffffffff878);
  std::operator<<(poVar4," ");
  local_306 = (short)cppcms::impl::cint<short>(0);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff880,
                      (write_int_to_stream<short> *)in_stack_fffffffffffff878);
  std::operator<<(poVar4," ");
  local_308 = (short)cppcms::impl::cint<short>(0);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff880,
                      (write_int_to_stream<short> *)in_stack_fffffffffffff878);
  std::operator<<(poVar4," ");
  local_30a = (short)cppcms::impl::cint<short>(0);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff880,
                      (write_int_to_stream<short> *)in_stack_fffffffffffff878);
  std::operator<<(poVar4," ");
  local_30c = (short)cppcms::impl::cint<short>(0);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff880,
                      (write_int_to_stream<short> *)in_stack_fffffffffffff878);
  std::operator<<(poVar4," ");
  local_30e = (short)cppcms::impl::cint<short>(0);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff880,
                      (write_int_to_stream<short> *)in_stack_fffffffffffff878);
  std::operator<<(poVar4," ");
  sVar3 = std::numeric_limits<short>::min();
  poVar4 = (ostream *)std::ostream::operator<<(local_2f0,sVar3);
  poVar4 = std::operator<<(poVar4," ");
  sVar3 = std::numeric_limits<short>::max();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,-1);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,10);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,-10);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3039);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,-0x3039);
  std::operator<<(poVar4," ");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator!=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_330);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error!!! \n   ");
    std::__cxx11::ostringstream::str();
    poVar4 = std::operator<<(poVar4,local_370);
    poVar4 = std::operator<<(poVar4,"\n   ");
    std::__cxx11::ostringstream::str();
    poVar4 = std::operator<<(poVar4,local_390);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_390);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    _Var2 = std::operator==(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::string::~string(local_3b0);
    if (!_Var2) {
      std::__cxx11::ostringstream::ostringstream(local_548);
      poVar4 = std::operator<<((ostream *)local_548,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/todec_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x20);
      std::operator<<(poVar4," a.str() == b.str()");
      local_569 = 1;
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this,local_568);
      local_569 = 0;
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Ok       \n   ");
    std::__cxx11::ostringstream::str();
    poVar4 = std::operator<<(poVar4,local_590);
    poVar4 = std::operator<<(poVar4,"\n   ");
    std::__cxx11::ostringstream::str();
    poVar4 = std::operator<<(poVar4,local_5b0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_5b0);
    std::__cxx11::string::~string(local_590);
  }
  std::__cxx11::ostringstream::~ostringstream(local_2f0);
  std::__cxx11::ostringstream::~ostringstream(local_178);
  return;
}

Assistant:

void test_single()
{
	using cppcms::impl::cint;
	std::ostringstream a,b;
	a 	<< cint(std::numeric_limits<T>::min()) << " " 
		<< cint(std::numeric_limits<T>::max()) << " " 
		<< cint(T(1)) << " "
		<< cint(T(0)) << " "
		<< cint(T(-1)) << " "
		<< cint(T(10)) << " "
		<< cint(T(-10)) << " "
		<< cint(T(12345)) << " "
		<< cint(T(-12345)) << " ";
	b	<< (std::numeric_limits<T>::min()) << " " 
		<< (std::numeric_limits<T>::max()) << " " 
		<< (T(1)) << " "
		<< (T(0)) << " "
		<< (T(-1)) << " "
		<< (T(10)) << " "
		<< (T(-10)) << " "
		<< (T(12345)) << " "
		<< (T(-12345)) << " ";
	if(a.str()!=b.str()) {
		std::cerr << "Error!!! \n   " << a.str() << "\n   " << b.str() << std::endl;
		TEST(a.str() == b.str());
	}
	else {
		std::cout << "Ok       \n   " << a.str() << "\n   " << b.str() << std::endl;
	}
}